

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deviceinfo.cc
# Opt level: O0

void __thiscall rcdiscover::DeviceInfo::DeviceInfo(DeviceInfo *this,string *iface_name)

{
  string *in_RSI;
  string *in_RDI;
  DeviceInfo *this_00;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  std::__cxx11::string::string(in_RDI + 0x40);
  this_00 = (DeviceInfo *)(in_RDI + 0x60);
  std::__cxx11::string::string((string *)this_00);
  std::__cxx11::string::string(in_RDI + 0x80);
  std::__cxx11::string::string(in_RDI + 0xa0);
  std::__cxx11::string::string(in_RDI + 0xc0);
  std::__cxx11::string::string(in_RDI + 0xe0);
  clear(this_00);
  return;
}

Assistant:

DeviceInfo::DeviceInfo(std::string iface_name) :
    iface_name(std::move(iface_name))
{
  clear();
}